

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qresource.cpp
# Opt level: O0

QString * __thiscall QResourceFileEngine::fileName(QResourceFileEngine *this,FileName file)

{
  QLatin1StringView latin1;
  QResource *this_00;
  qsizetype qVar1;
  int in_EDX;
  QString *in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView QVar2;
  qsizetype slash_2;
  qsizetype slash_1;
  qsizetype slash;
  QResourceFileEnginePrivate *d;
  QString absoluteFilePath;
  QString path;
  undefined4 in_stack_fffffffffffffee8;
  CaseSensitivity in_stack_fffffffffffffeec;
  QString *in_stack_fffffffffffffef0;
  QResource *in_stack_fffffffffffffef8;
  QChar QVar3;
  QString *this_01;
  QString *in_stack_ffffffffffffff10;
  undefined8 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  QChar local_7a;
  undefined1 *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  QChar local_5a;
  undefined1 *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  QChar local_22 [13];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  d_func((QResourceFileEngine *)0x2ea2ad);
  if (in_EDX == 1) {
    QResource::fileName(in_stack_fffffffffffffef8);
    QVar3.ucs = (char16_t)((ulong)in_stack_fffffffffffffef8 >> 0x30);
    QChar::QChar<char16_t,_true>(local_22,L'/');
    this_00 = (QResource *)
              QString::lastIndexOf(in_stack_fffffffffffffef0,QVar3,in_stack_fffffffffffffeec);
    QString::~QString((QString *)0x2ea314);
    if (this_00 == (QResource *)0xffffffffffffffff) {
      QResource::fileName((QResource *)0xffffffffffffffff);
    }
    else {
      QResource::fileName(this_00);
      QString::mid(in_stack_ffffffffffffff10,(qsizetype)this_01,(qsizetype)in_RDI);
      QString::~QString((QString *)0x2ea386);
    }
    goto LAB_002ea663;
  }
  if ((in_EDX == 2) || (in_EDX == 4)) {
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    local_50 = &DAT_aaaaaaaaaaaaaaaa;
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    if (in_EDX == 4) {
      QResource::absoluteFilePath(in_stack_fffffffffffffef8);
    }
    else {
      QResource::fileName(in_stack_fffffffffffffef8);
    }
    QChar::QChar<char16_t,_true>(&local_5a,L'/');
    qVar1 = QString::lastIndexOf
                      (in_stack_fffffffffffffef0,
                       (QChar)(char16_t)((ulong)in_stack_fffffffffffffef8 >> 0x30),
                       in_stack_fffffffffffffeec);
    if (qVar1 == -1) {
      Qt::Literals::StringLiterals::operator____L1
                ((char *)in_stack_fffffffffffffef8,(size_t)in_stack_fffffffffffffef0);
      QVar2.m_data._0_4_ = in_stack_ffffffffffffff28;
      QVar2.m_size = in_stack_ffffffffffffff20;
      QVar2.m_data._4_4_ = in_stack_ffffffffffffff2c;
      QString::QString(in_RDI,QVar2);
    }
    else if (qVar1 < 2) {
      QVar2 = Qt::Literals::StringLiterals::operator____L1
                        ((char *)in_stack_fffffffffffffef8,(size_t)in_stack_fffffffffffffef0);
      latin1.m_data._0_4_ = in_stack_ffffffffffffff28;
      latin1.m_size = (qsizetype)QVar2.m_data;
      latin1.m_data._4_4_ = in_stack_ffffffffffffff2c;
      QString::QString(in_RDI,latin1);
    }
    else {
      QString::left(this_01,(qsizetype)in_RDI);
    }
    QString::~QString((QString *)0x2ea53a);
    goto LAB_002ea663;
  }
  if ((in_EDX != 6) && (in_EDX != 7)) {
    QResource::fileName(in_stack_fffffffffffffef8);
    goto LAB_002ea663;
  }
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  local_70 = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  QResource::absoluteFilePath(in_stack_fffffffffffffef8);
  QVar3.ucs = (char16_t)((ulong)in_stack_fffffffffffffef8 >> 0x30);
  if (in_EDX == 7) {
    QChar::QChar<char16_t,_true>(&local_7a,L'/');
    qVar1 = QString::lastIndexOf(in_stack_fffffffffffffef0,QVar3,in_stack_fffffffffffffeec);
    if (qVar1 == -1) goto LAB_002ea623;
    QString::left(this_01,(qsizetype)in_RDI);
  }
  else {
LAB_002ea623:
    QString::QString(in_stack_fffffffffffffef0,
                     (QString *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  }
  QString::~QString((QString *)0x2ea64a);
LAB_002ea663:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return this_01;
}

Assistant:

QString QResourceFileEngine::fileName(FileName file) const
{
    Q_D(const QResourceFileEngine);
    if (file == BaseName) {
        const qsizetype slash = d->resource.fileName().lastIndexOf(u'/');
        if (slash == -1)
            return d->resource.fileName();
        return d->resource.fileName().mid(slash + 1);
    } else if (file == PathName || file == AbsolutePathName) {
        const QString path = (file == AbsolutePathName) ? d->resource.absoluteFilePath()
                                                        : d->resource.fileName();
        const qsizetype slash = path.lastIndexOf(u'/');
        if (slash == -1)
            return ":"_L1;
        else if (slash <= 1)
            return ":/"_L1;
        return path.left(slash);

    } else if (file == CanonicalName || file == CanonicalPathName) {
        const QString absoluteFilePath = d->resource.absoluteFilePath();
        if (file == CanonicalPathName) {
            const qsizetype slash = absoluteFilePath.lastIndexOf(u'/');
            if (slash != -1)
                return absoluteFilePath.left(slash);
        }
        return absoluteFilePath;
    }
    return d->resource.fileName();
}